

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall
Memory::Recycler::EnableConcurrent(Recycler *this,ThreadService *threadService,bool startAllThreads)

{
  bool bVar1;
  bool bVar2;
  DWORD DVar3;
  HANDLE hObject;
  RecyclerParallelThread *this_00;
  byte bVar4;
  HANDLE local_48;
  HANDLE handle [2];
  
  if (this->disableConcurrent != false) {
    return false;
  }
  bVar1 = InitializeConcurrent(this,threadService);
  if (!bVar1) {
    return false;
  }
  bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,ConcurrentMarkPhase);
  this->enableConcurrentMark = !bVar1;
  bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,ParallelMarkPhase);
  this->enableParallelMark = !bVar1;
  bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,ConcurrentSweepPhase);
  this->enableConcurrentSweep = !bVar1;
  bVar4 = this->enableParallelMark;
  if ((this->maxParallelism == 1 & bVar4) == 1) {
    this->enableParallelMark = false;
    bVar4 = 0;
  }
  if (threadService->threadService != (ThreadServiceCallback)0x0) {
    this->threadService = threadService;
    return true;
  }
  bVar4 = startAllThreads & bVar4 & 2 < this->maxParallelism;
  if (bVar4 == 1) {
    this_00 = &this->parallelThread1;
    bVar1 = RecyclerParallelThread::EnableConcurrent(this_00,true);
    if (!bVar1) goto LAB_0067d3a6;
    if (this->maxParallelism < 4) goto LAB_0067d328;
    bVar2 = RecyclerParallelThread::EnableConcurrent(&this->parallelThread2,true);
    bVar1 = true;
    if (bVar2) goto LAB_0067d32b;
  }
  else {
LAB_0067d328:
    bVar1 = false;
LAB_0067d32b:
    hObject = (HANDLE)PlatformAgnostic::Thread::Create
                                (300000,StaticThreadProc,this,ThreadInitStackSizeParamIsAReservation
                                 ,L"Chakra Background Recycler");
    if (hObject != (HANDLE)0xffffffffffffffff) {
      local_48 = this->concurrentWorkDoneEvent;
      handle[0] = hObject;
      DVar3 = WaitForMultipleObjectsEx(2,&local_48,0,0xffffffff,0);
      if (DVar3 == 0) {
        this->threadService = threadService;
        this->concurrentThread = hObject;
        return true;
      }
      CloseHandle(hObject);
    }
    if ((bVar4 == 0) || (RecyclerParallelThread::Shutdown(&this->parallelThread1), !bVar1))
    goto LAB_0067d3a6;
    this_00 = &this->parallelThread2;
  }
  RecyclerParallelThread::Shutdown(this_00);
LAB_0067d3a6:
  this->enableConcurrentMark = false;
  this->enableParallelMark = false;
  this->enableConcurrentSweep = false;
  if (this->concurrentWorkReadyEvent != (HANDLE)0x0) {
    CloseHandle(this->concurrentWorkReadyEvent);
    this->concurrentWorkReadyEvent = (HANDLE)0x0;
  }
  if (this->concurrentWorkDoneEvent != (HANDLE)0x0) {
    CloseHandle(this->concurrentWorkDoneEvent);
    this->concurrentWorkDoneEvent = (HANDLE)0x0;
  }
  if (this->concurrentIdleDecommitEvent != (HANDLE)0x0) {
    CloseHandle(this->concurrentIdleDecommitEvent);
    this->concurrentIdleDecommitEvent = (HANDLE)0x0;
  }
  return false;
}

Assistant:

bool
Recycler::EnableConcurrent(JsUtil::ThreadService *threadService, bool startAllThreads)
{
    if (this->disableConcurrent)
    {
        return false;
    }

    if (!this->InitializeConcurrent(threadService))
    {
        return false;
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    this->enableConcurrentMark = !CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentMarkPhase);
    this->enableParallelMark = !CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ParallelMarkPhase);
    this->enableConcurrentSweep = !CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentSweepPhase);
#else
    this->enableConcurrentMark = true;
    this->enableParallelMark = true;
    this->enableConcurrentSweep = true;
#endif

    if (this->enableParallelMark && this->maxParallelism == 1)
    {
        // Disable parallel mark if only 1 CPU
        this->enableParallelMark = false;
    }

    if (threadService->HasCallback())
    {
        this->threadService = threadService;
        return true;
    }
    else
    {
        bool startConcurrentThread = true;
        bool startedParallelThread1 = false;
        bool startedParallelThread2 = false;

        if (startAllThreads)
        {
            if (this->enableParallelMark && this->maxParallelism > 2)
            {
                if (!parallelThread1.EnableConcurrent(true))
                {
                    startConcurrentThread = false;
                }
                else
                {
                    startedParallelThread1 = true;
                    if (this->maxParallelism > 3)
                    {
                        if (!parallelThread2.EnableConcurrent(true))
                        {
                            startConcurrentThread = false;
                        }
                        else
                        {
                            startedParallelThread2 = true;
                        }
                    }
                }
            }
        }

        if (startConcurrentThread)
        {
            auto concurrentThread = PlatformAgnostic::Thread::Create(Recycler::ConcurrentThreadStackSize, 
                &Recycler::StaticThreadProc, this, 
                PlatformAgnostic::Thread::ThreadInitStackSizeParamIsAReservation,
                _u("Chakra Background Recycler"));

            if (concurrentThread != PlatformAgnostic::Thread::InvalidHandle)
            {
                HANDLE concurrentThreadWin32Handle = reinterpret_cast<HANDLE>(concurrentThread);
                // Wait for recycler thread to initialize
                HANDLE handle[2] = { this->concurrentWorkDoneEvent, concurrentThreadWin32Handle };
                DWORD ret = WaitForMultipleObjectsEx(2, handle, FALSE, INFINITE, FALSE);
                if (ret == WAIT_OBJECT_0)
                {
                    this->threadService = threadService;
                    this->concurrentThread = concurrentThreadWin32Handle;
                    return true;
                }

                CloseHandle(concurrentThreadWin32Handle);
            }
        }

        if (startedParallelThread1)
        {
            parallelThread1.Shutdown();
            if (startedParallelThread2)
            {
                parallelThread2.Shutdown();
            }
        }
    }

    // We failed to start a concurrent thread so we set these back to false and clean up
    this->enableConcurrentMark = false;
    this->enableParallelMark = false;
    this->enableConcurrentSweep = false;

    if (concurrentWorkReadyEvent)
    {
        CloseHandle(concurrentWorkReadyEvent);
        concurrentWorkReadyEvent = nullptr;
    }
    if (concurrentWorkDoneEvent)
    {
        CloseHandle(concurrentWorkDoneEvent);
        concurrentWorkDoneEvent = nullptr;
    }
#ifdef IDLE_DECOMMIT_ENABLED
    if (concurrentIdleDecommitEvent)
    {
        CloseHandle(concurrentIdleDecommitEvent);
        concurrentIdleDecommitEvent = nullptr;
    }
#endif

    return false;
}